

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall google::protobuf::Symbol::GetFile(Symbol *this)

{
  Descriptor *this_00;
  EnumDescriptor *this_01;
  ServiceDescriptor *this_02;
  undefined4 *in_RDI;
  FileDescriptor *local_8;
  
  switch(*in_RDI) {
  case 0:
    local_8 = (FileDescriptor *)0x0;
    break;
  case 1:
    local_8 = Descriptor::file(*(Descriptor **)(in_RDI + 2));
    break;
  case 2:
    local_8 = FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 2));
    break;
  case 3:
    this_00 = OneofDescriptor::containing_type(*(OneofDescriptor **)(in_RDI + 2));
    local_8 = Descriptor::file(this_00);
    break;
  case 4:
    local_8 = EnumDescriptor::file(*(EnumDescriptor **)(in_RDI + 2));
    break;
  case 5:
    this_01 = EnumValueDescriptor::type(*(EnumValueDescriptor **)(in_RDI + 2));
    local_8 = EnumDescriptor::file(this_01);
    break;
  case 6:
    local_8 = ServiceDescriptor::file(*(ServiceDescriptor **)(in_RDI + 2));
    break;
  case 7:
    this_02 = MethodDescriptor::service(*(MethodDescriptor **)(in_RDI + 2));
    local_8 = ServiceDescriptor::file(this_02);
    break;
  case 8:
    local_8 = *(FileDescriptor **)(in_RDI + 2);
    break;
  default:
    local_8 = (FileDescriptor *)0x0;
  }
  return local_8;
}

Assistant:

const FileDescriptor* GetFile() const {
    switch (type) {
      case NULL_SYMBOL:
        return nullptr;
      case MESSAGE:
        return descriptor->file();
      case FIELD:
        return field_descriptor->file();
      case ONEOF:
        return oneof_descriptor->containing_type()->file();
      case ENUM:
        return enum_descriptor->file();
      case ENUM_VALUE:
        return enum_value_descriptor->type()->file();
      case SERVICE:
        return service_descriptor->file();
      case METHOD:
        return method_descriptor->service()->file();
      case PACKAGE:
        return package_file_descriptor;
    }
    return nullptr;
  }